

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLSGetNumLinIters(void *arkode_mem,long *nliters)

{
  int iVar1;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkLs_AccessLMem(arkode_mem,"arkLSGetNumLinIters",&local_10,&local_18);
  if (iVar1 == 0) {
    *nliters = local_18->nli;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkLSGetNumLinIters(void *arkode_mem, long int *nliters)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure; set output value and return */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSGetNumLinIters",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  *nliters = arkls_mem->nli;
  return(ARKLS_SUCCESS);
}